

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::DirWatcherGeneric::watchDir(DirWatcherGeneric *this,string *dir)

{
  bool *pbVar1;
  DirWatcherGeneric *this_00;
  string local_78;
  byte local_41;
  string local_40;
  DirWatcherGeneric *local_20;
  DirWatcherGeneric *watcher;
  string *dir_local;
  DirWatcherGeneric *this_local;
  
  watcher = (DirWatcherGeneric *)dir;
  dir_local = (string *)this;
  pbVar1 = FileWatcher::allowOutOfScopeLinks(this->Watch->WatcherImpl->mFileWatcher);
  local_41 = 0;
  if ((*pbVar1 & 1U) == 0) {
    std::__cxx11::string::string((string *)&local_78,(string *)watcher);
    this_00 = findDirWatcherFast(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)watcher);
    local_41 = 1;
    this_00 = findDirWatcher(this,&local_40);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (this_00 != (DirWatcherGeneric *)0x0) {
    local_20 = this_00;
    watch(this_00,true);
  }
  return;
}

Assistant:

void DirWatcherGeneric::watchDir( std::string &dir )
{
	DirWatcherGeneric * watcher = Watch->WatcherImpl->mFileWatcher->allowOutOfScopeLinks() ?
									findDirWatcher( dir ) :
									findDirWatcherFast( dir );

	if ( NULL != watcher )
	{
		watcher->watch( true );
	}
}